

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_estimateCDictSize_advanced
                 (size_t dictSize,ZSTD_compressionParameters cParams,
                 ZSTD_dictLoadMethod_e dictLoadMethod)

{
  size_t sVar1;
  long lVar2;
  ZSTD_paramSwitch_e useRowMatchFinder;
  
  useRowMatchFinder = ZSTD_ps_disable;
  if (0xfffffffc < cParams.strategy - ZSTD_btlazy2) {
    useRowMatchFinder = (cParams.windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar1 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,1,0);
  lVar2 = (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar2 = 0x39c0;
  }
  return sVar1 + lVar2;
}

Assistant:

size_t ZSTD_estimateCDictSize_advanced(
        size_t dictSize, ZSTD_compressionParameters cParams,
        ZSTD_dictLoadMethod_e dictLoadMethod)
{
    DEBUGLOG(5, "sizeof(ZSTD_CDict) : %u", (unsigned)sizeof(ZSTD_CDict));
    return ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
         + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
         /* enableDedicatedDictSearch == 1 ensures that CDict estimation will not be too small
          * in case we are using DDS with row-hash. */
         + ZSTD_sizeof_matchState(&cParams, ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto, &cParams),
                                  /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0)
         + (dictLoadMethod == ZSTD_dlm_byRef ? 0
            : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void *))));
}